

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string_view __thiscall google::protobuf::Symbol::full_name(Symbol *this)

{
  long *plVar1;
  FeatureSet *this_00;
  ulong uVar2;
  FileDescriptor *pFVar3;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  size_t sVar4;
  undefined8 *puVar5;
  SymbolBase *pSVar6;
  long lVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar8;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  uint uVar9;
  Symbol *in_RSI;
  long *plVar10;
  undefined1 *puVar11;
  SymbolBase *pSVar12;
  bool bVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  undefined1 auStack_50 [8];
  undefined8 uStack_48;
  undefined1 auStack_40 [16];
  long local_10 [2];
  
  pSVar12 = this->ptr_;
  switch(pSVar12->symbol_type_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\a':
  case '\b':
    puVar5 = (undefined8 *)(*(long *)(pSVar12 + 8) + 0x20);
    uVar2 = *(ulong *)(*(long *)(pSVar12 + 8) + 0x28);
    break;
  default:
    plVar10 = local_10;
    full_name();
    puVar11 = auStack_40;
    pSVar12 = in_RSI->ptr_;
    pcVar8 = extraout_RDX;
    switch(pSVar12->symbol_type_) {
    case '\x01':
      pFVar3 = *(FileDescriptor **)(pSVar12 + 0x18);
      if (pFVar3 == (FileDescriptor *)0x0) {
        uStack_48 = 0x20aa88;
        pFVar3 = GetFile(in_RSI);
        pSVar6 = in_RSI->ptr_;
        bVar13 = pSVar6->symbol_type_ == '\x01';
        pcVar8 = extraout_RDX_01;
        goto LAB_0020aac0;
      }
      break;
    case '\x02':
      pFVar3 = *(FileDescriptor **)(pSVar12 + (ulong)(pSVar12[1].symbol_type_ & 8) + 0x20);
      if (pFVar3 == (FileDescriptor *)0x0) {
        uStack_48 = 0x20aaad;
        pFVar3 = GetFile(in_RSI);
        pcVar8 = extraout_RDX_02;
      }
      break;
    case '\x03':
    case '\b':
      pFVar3 = *(FileDescriptor **)(pSVar12 + 0x10);
      break;
    case '\x04':
      pFVar3 = *(FileDescriptor **)(pSVar12 + 0x18);
      if (pFVar3 == (FileDescriptor *)0x0) {
        uStack_48 = 0x20aa6c;
        pFVar3 = GetFile(in_RSI);
        pSVar6 = in_RSI->ptr_;
        bVar13 = pSVar6->symbol_type_ == '\x04';
        pcVar8 = extraout_RDX_00;
        goto LAB_0020aac0;
      }
      break;
    case '\x05':
      pFVar3 = *(FileDescriptor **)(*(long *)(pSVar12 + 0x10) + 0x18);
      if (pFVar3 == (FileDescriptor *)0x0) {
        uStack_48 = 0x20ab0d;
        pFVar3 = GetFile(in_RSI);
        pSVar12 = in_RSI->ptr_;
        lVar7 = -(ulong)(pSVar12->symbol_type_ != '\x05');
        pcVar8 = extraout_RDX_04;
      }
      else {
        lVar7 = 0;
      }
      pSVar12 = pSVar12 + lVar7 + 8;
      goto LAB_0020aac8;
    case '\x06':
      pFVar3 = *(FileDescriptor **)(pSVar12 + 0xf);
      pSVar12 = pSVar12 + 7;
      goto LAB_0020aac8;
    case '\a':
      uStack_48 = 0x20aab7;
      pFVar3 = GetFile(in_RSI);
      pSVar6 = in_RSI->ptr_;
      bVar13 = pSVar6->symbol_type_ == '\a';
      pcVar8 = extraout_RDX_03;
LAB_0020aac0:
      pSVar12 = (SymbolBase *)0x0;
      if (bVar13) {
        pSVar12 = pSVar6;
      }
      break;
    default:
      uStack_48 = 0x20ab2d;
      parent_name_key();
      uVar9 = (uint)in_RSI;
      if ((int)uVar9 < 0) {
        uVar9 = (uint)auStack_50;
        EnumDescriptor::value();
      }
      else if ((int)uVar9 < *(int *)(puVar11 + 4)) {
        sVar16._M_len = ((ulong)in_RSI & 0xffffffff) * 0x30 + *(long *)(puVar11 + 0x38);
        sVar16._M_str = extraout_RDX_05;
        return sVar16;
      }
      puVar5 = (undefined8 *)(ulong)uVar9;
      EnumDescriptor::value();
      this_00 = (FeatureSet *)*puVar5;
      sVar4 = extraout_RAX;
      pcVar8 = extraout_RDX_06;
      if (this_00 != (FeatureSet *)0x0) {
        FeatureSet::~FeatureSet(this_00);
        operator_delete(this_00,0x48);
        sVar4 = extraout_RAX_00;
        pcVar8 = extraout_RDX_07;
      }
      *puVar5 = 0;
      sVar17._M_str = pcVar8;
      sVar17._M_len = sVar4;
      return sVar17;
    }
    pSVar12 = pSVar12 + 8;
LAB_0020aac8:
    plVar1 = *(long **)pSVar12;
    *plVar10 = (long)pFVar3;
    lVar7 = *plVar1;
    plVar10[1] = plVar1[1];
    plVar10[2] = lVar7;
    sVar15._M_str = pcVar8;
    sVar15._M_len = (size_t)plVar10;
    return sVar15;
  case '\t':
    puVar5 = *(undefined8 **)(pSVar12 + 0x10);
    uVar2 = puVar5[1];
    break;
  case '\n':
    puVar5 = *(undefined8 **)(*(long *)(pSVar12 + 8) + 0x10);
    uVar2 = (long)*(int *)(pSVar12 + 4);
    if ((ulong)puVar5[1] < (ulong)(long)*(int *)(pSVar12 + 4)) {
      uVar2 = puVar5[1];
    }
  }
  sVar14._M_str = (char *)*puVar5;
  sVar14._M_len = uVar2;
  return sVar14;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }